

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall fixedMeasurement_invalid_Test::TestBody(fixedMeasurement_invalid_Test *this)

{
  bool bVar1;
  char *in_R9;
  string local_50;
  AssertHelper local_30;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_50._M_dataplus._M_p = &DAT_13f800000;
  bVar1 = units::unit::operator==((unit *)&local_50,(unit *)&units::one);
  if (!bVar1) {
    units::unit::operator==((unit *)&local_50,(unit *)&units::defunit);
  }
  local_50._M_dataplus._M_p = &DAT_13f800000;
  bVar1 = units::unit::operator==((unit *)&local_50,(unit *)&units::one);
  if (!bVar1) {
    units::unit::operator==((unit *)&local_50,(unit *)&units::defunit);
  }
  local_50._M_dataplus._M_p = &DAT_13f800000;
  bVar1 = units::unit::operator==((unit *)&local_50,(unit *)&units::one);
  if (!bVar1) {
    units::unit::operator==((unit *)&local_50,(unit *)&units::defunit);
  }
  local_50._M_dataplus._M_p = &DAT_13f800000;
  bVar1 = units::unit::operator==((unit *)&local_50,(unit *)&units::one);
  if (((bVar1) ||
      (bVar1 = units::unit::operator==((unit *)&local_50,(unit *)&units::defunit), bVar1)) ||
     (local_50._M_dataplus._M_p._0_4_ <= 0.0)) {
    local_20[0] = (internal)0x0;
    local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,local_20,(AssertionResult *)"isnormal(iv5)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1ce,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
    if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_18,local_18);
    }
  }
  return;
}

Assistant:

TEST(fixedMeasurement, invalid)
{
    fixed_measurement iv1(1.2, invalid);
    EXPECT_FALSE(is_valid(iv1));
    EXPECT_FALSE(isnormal(iv1));

    fixed_measurement iv2(constants::invalid_conversion, m);
    EXPECT_FALSE(is_valid(iv2));
    EXPECT_FALSE(isnormal(iv2));

    fixed_measurement iv3(constants::infinity, m);
    EXPECT_TRUE(is_valid(iv3));
    EXPECT_FALSE(isnormal(iv3));

    fixed_measurement iv4(1e-311, m);  // subnormal
    EXPECT_TRUE(is_valid(iv4));
    EXPECT_FALSE(isnormal(iv4));

    fixed_measurement iv5(0.0, m);
    EXPECT_TRUE(is_valid(iv5));
    EXPECT_TRUE(isnormal(iv5));
}